

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lucas.c
# Opt level: O1

float PsiEN(float *ve,float *va)

{
  float fVar1;
  float fVar2;
  float fVar3;
  int i;
  long lVar4;
  float sum;
  float fVar5;
  double dVar6;
  double dVar7;
  float fVar8;
  float fVar9;
  
  fVar5 = 0.0;
  lVar4 = 0;
  do {
    fVar5 = fVar5 + va[lVar4] * va[lVar4];
    lVar4 = lVar4 + 1;
  } while (lVar4 != 2);
  if (fVar5 < 0.0) {
    fVar5 = sqrtf(fVar5);
  }
  else {
    fVar5 = SQRT(fVar5);
  }
  fVar8 = 0.0;
  lVar4 = 0;
  do {
    fVar8 = fVar8 + ve[lVar4] * ve[lVar4];
    lVar4 = lVar4 + 1;
  } while (lVar4 != 2);
  if (fVar8 < 0.0) {
    fVar8 = sqrtf(fVar8);
  }
  else {
    fVar8 = SQRT(fVar8);
  }
  if ((double)fVar8 <= 1e-08) {
    fVar9 = 100.0;
  }
  else {
    fVar1 = *ve;
    fVar2 = ve[1];
    fVar9 = va[1];
    fVar3 = *va;
    dVar6 = (double)(fVar5 * fVar5) + 1.0;
    if (dVar6 < 0.0) {
      dVar6 = sqrt(dVar6);
    }
    else {
      dVar6 = SQRT(dVar6);
    }
    dVar7 = (double)(fVar8 * fVar8) + 1.0;
    if (dVar7 < 0.0) {
      dVar7 = sqrt(dVar7);
    }
    else {
      dVar7 = SQRT(dVar7);
    }
    dVar6 = (double)(float)((double)((fVar3 * (fVar1 / fVar8) + fVar9 * (fVar2 / fVar8)) - fVar8) /
                           (dVar6 * dVar7));
    dVar7 = asin(dVar6);
    fVar9 = (float)((dVar7 * 180.0) / 3.141592653589793);
    if (90.0 < ABS(fVar9)) {
      printf("ERROR in PSIEN()  v1: %f ve: %f\n",(double)fVar9,dVar6);
      printf("nve: %f nva: %f\n",(double)fVar8,(double)fVar5);
      printf("n: %f %f\n",(double)(fVar1 / fVar8),(double)(fVar2 / fVar8));
      printf(" ve: %f %f va: %f %f\n",(double)*ve,(double)ve[1],SUB84((double)*va,0),(double)va[1]);
      fflush(_stdout);
    }
  }
  return ABS(fVar9);
}

Assistant:

float PsiEN(float ve[],float va[])
{
float nva,nve;
float v1,v2;
float n[2];

nva = norm(va,2), nve = norm(ve,2);
if(nve > 0.00000001)
{
n[0] = ve[0]/nve;
n[1] = ve[1]/nve;
v1 = (va[0]*n[0] + va[1]*n[1]-nve) ;
v2 = (float) (v1/(sqrt((1.0+nva*nva))*sqrt((1.0+nve*nve))));
v1 =  (float) (asin(v2)*180.0/HALF_C);

if(!(v1>=-90.0 && v1<=90.0))
	{
       	printf("ERROR in PSIEN()  v1: %f ve: %f\n",v1,v2);
	printf("nve: %f nva: %f\n",nve,nva);
	printf("n: %f %f\n",n[0],n[1]);
	printf(" ve: %f %f va: %f %f\n",ve[0],ve[1],va[0],va[1]);
	fflush(stdout);
	}
}
else v1 = NO_VALUE;

return (float) fabs(v1);
}